

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O1

void osgen_gridwin_resize(osgen_gridwin_t *win,size_t new_wid,size_t new_ht)

{
  char *pcVar1;
  osgen_charcolor_t *poVar2;
  osgen_charcolor_t *__src;
  osgen_charcolor_t *poVar3;
  char *__src_00;
  char *pcVar4;
  ulong uVar5;
  size_t sVar6;
  
  uVar5 = win->grid_wid;
  if ((uVar5 < new_wid) || (win->grid_ht < new_ht)) {
    if (new_wid < uVar5) {
      new_wid = uVar5;
    }
    if (new_ht < win->grid_ht) {
      new_ht = win->grid_ht;
    }
    pcVar1 = (char *)malloc(new_ht * new_wid);
    poVar2 = (osgen_charcolor_t *)malloc(new_ht * new_wid * 2);
    poVar3 = poVar2;
    pcVar4 = pcVar1;
    if (win->grid_ht == 0) {
      uVar5 = 0;
    }
    else {
      __src_00 = win->grid_txt;
      __src = win->grid_color;
      uVar5 = 0;
      do {
        sVar6 = win->grid_wid;
        memcpy(pcVar4,__src_00,sVar6);
        memcpy(poVar3,__src,sVar6 * 2);
        for (; new_wid != sVar6; sVar6 = sVar6 + 1) {
          pcVar4[sVar6] = ' ';
          poVar3[sVar6].fg = '\x02';
          poVar3[sVar6].bg = '\x01';
        }
        __src_00 = __src_00 + win->grid_wid;
        __src = __src + win->grid_wid;
        pcVar4 = pcVar4 + new_wid;
        poVar3 = poVar3 + new_wid;
        uVar5 = uVar5 + 1;
      } while (uVar5 < win->grid_ht);
    }
    if (uVar5 < new_ht) {
      do {
        if (new_wid != 0) {
          memset(pcVar4,0x20,new_wid);
          sVar6 = 0;
          do {
            poVar3[sVar6].fg = '\x02';
            poVar3[sVar6].bg = '\x01';
            sVar6 = sVar6 + 1;
          } while (new_wid != sVar6);
        }
        uVar5 = uVar5 + 1;
        pcVar4 = pcVar4 + new_wid;
        poVar3 = poVar3 + new_wid;
      } while (uVar5 != new_ht);
    }
    free(win->grid_txt);
    free(win->grid_color);
    win->grid_txt = pcVar1;
    win->grid_color = poVar2;
    win->grid_wid = new_wid;
    win->grid_ht = new_ht;
  }
  return;
}

Assistant:

static void osgen_gridwin_resize(osgen_gridwin_t *win,
                                 size_t new_wid, size_t new_ht)
{
    /* if the window's size is now bigger than the grid, expand the grid */
    if (new_wid > win->grid_wid || new_ht > win->grid_ht)
    {
        char *new_txt;
        osgen_charcolor_t *new_color;
        char *tsrc, *tdst;
        osgen_charcolor_t *csrc, *cdst;
        size_t y;

        /*  
         *   use the larger of the old size and the new size, so that the
         *   window only expands (this somewhat simplifies copying the old
         *   to the new) 
         */
        if (win->grid_wid > new_wid)
            new_wid = win->grid_wid;
        if (win->grid_ht > new_ht)
            new_ht = win->grid_ht;

        /* allocate the new arrays */
        new_txt = (char *)osmalloc(new_wid * new_ht);
        new_color = (osgen_charcolor_t *)osmalloc(
            new_wid * new_ht * sizeof(new_color[0]));

        /* copy the old grid to the new grid */
        tsrc = win->grid_txt;
        csrc = win->grid_color;
        tdst = new_txt;
        cdst = new_color;
        for (y = 0 ; y < win->grid_ht ; ++y)
        {
            /* copy the old text and color data */
            memcpy(tdst, tsrc, win->grid_wid);
            memcpy(cdst, csrc, win->grid_wid * sizeof(cdst[0]));

            /* clear the rest of the line if expanding the width */
            osgen_gridwin_clear_ptr(tdst + win->grid_wid,
                                    cdst + win->grid_wid,
                                    new_wid - win->grid_wid);

            /* advance the pointers */
            tsrc += win->grid_wid;
            csrc += win->grid_wid;
            tdst += new_wid;
            cdst += new_wid;
        }

        /* clear all remaining lines */
        for ( ; y < new_ht ; ++y, tdst += new_wid, cdst += new_wid)
            osgen_gridwin_clear_ptr(tdst, cdst, new_wid);

        /* delete the old buffers */
        osfree(win->grid_txt);
        osfree(win->grid_color);

        /* set the new buffers and sizes */
        win->grid_txt = new_txt;
        win->grid_color = new_color;
        win->grid_wid = new_wid;
        win->grid_ht = new_ht;
    }
}